

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ModuleData * __thiscall ExpressionContext::GetSourceOwner(ExpressionContext *this,Lexeme *lexeme)

{
  uint uVar1;
  ModuleData **ppMVar2;
  ModuleData *moduleData;
  uint i;
  Lexeme *lexeme_local;
  ExpressionContext *this_local;
  
  if ((lexeme->pos < this->code) || (this->codeEnd < lexeme->pos)) {
    moduleData._4_4_ = 0;
    while( true ) {
      uVar1 = SmallArray<ModuleData_*,_128U>::size(&this->uniqueDependencies);
      if (uVar1 <= moduleData._4_4_) {
        __assert_fail("!\"failed to find source owner\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x808,"ModuleData *ExpressionContext::GetSourceOwner(Lexeme *)");
      }
      ppMVar2 = SmallArray<ModuleData_*,_128U>::operator[]
                          (&this->uniqueDependencies,moduleData._4_4_);
      this_local = (ExpressionContext *)*ppMVar2;
      if (((this_local->uniqueDependencies).little[0] <= lexeme) &&
         (lexeme <= (Lexeme *)
                    (&(this_local->uniqueDependencies).little[0]->source +
                    (ulong)*(uint *)((this_local->uniqueDependencies).little + 1) * 4))) break;
      moduleData._4_4_ = moduleData._4_4_ + 1;
    }
  }
  else {
    this_local = (ExpressionContext *)0x0;
  }
  return (ModuleData *)this_local;
}

Assistant:

ModuleData* ExpressionContext::GetSourceOwner(Lexeme *lexeme)
{
	// Fast check for current module
	if(lexeme->pos >= code && lexeme->pos <= codeEnd)
		return NULL;

	for(unsigned i = 0; i < uniqueDependencies.size(); i++)
	{
		ModuleData *moduleData = uniqueDependencies[i];

		if(lexeme >= moduleData->lexStream && lexeme <= moduleData->lexStream + moduleData->lexStreamSize)
			return moduleData;
	}

	// Should not get here
	assert(!"failed to find source owner");
	return NULL;
}